

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv6transmitter.cpp
# Opt level: O1

int __thiscall
jrtplib::RTPUDPv6Transmitter::SendRTPData(RTPUDPv6Transmitter *this,void *data,size_t len)

{
  HashElement *pHVar1;
  int iVar2;
  
  iVar2 = -0x72;
  if (((this->init == true) && (iVar2 = -0x71, this->created == true)) &&
     (iVar2 = -0x75, len <= this->maxpacksize)) {
    pHVar1 = (this->destinations).firsthashelem;
    (this->destinations).curhashelem = pHVar1;
    while (pHVar1 != (HashElement *)0x0) {
      sendto(this->rtpsock,data,len,0,(sockaddr *)&pHVar1->element,0x1c);
      pHVar1 = (this->destinations).curhashelem;
      if (pHVar1 != (HashElement *)0x0) {
        (this->destinations).curhashelem = pHVar1->listnext;
      }
      pHVar1 = (this->destinations).curhashelem;
    }
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int RTPUDPv6Transmitter::SendRTPData(const void *data,size_t len)	
{
	if (!init)
		return ERR_RTP_UDPV6TRANS_NOTINIT;

	MAINMUTEX_LOCK
	
	if (!created)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV6TRANS_NOTCREATED;
	}
	if (len > maxpacksize)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV6TRANS_SPECIFIEDSIZETOOBIG;
	}
	
	destinations.GotoFirstElement();
	while (destinations.HasCurrentElement())
	{
		sendto(rtpsock,(const char *)data,len,0,(const struct sockaddr *)destinations.GetCurrentElement().GetRTPSockAddr(),sizeof(struct sockaddr_in6));
		destinations.GotoNextElement();
	}
	
	MAINMUTEX_UNLOCK
	return 0;
}